

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::remove_pass_through_modules(Generator *top)

{
  undefined1 local_90 [8];
  RemovePassThroughVisitor visitor;
  Generator *top_local;
  
  visitor.pass_through_._M_h._M_single_bucket = (__node_base_ptr)top;
  RemovePassThroughVisitor::RemovePassThroughVisitor((RemovePassThroughVisitor *)local_90);
  IRVisitor::visit_generator_root
            ((IRVisitor *)local_90,(Generator *)visitor.pass_through_._M_h._M_single_bucket);
  RemovePassThroughVisitor::~RemovePassThroughVisitor((RemovePassThroughVisitor *)local_90);
  return;
}

Assistant:

void remove_pass_through_modules(Generator* top) {
    RemovePassThroughVisitor visitor;
    visitor.visit_generator_root(top);
}